

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Window.cpp
# Opt level: O2

void __thiscall cursespp::Window::OnParentVisibilityChanged(Window *this,bool visible)

{
  undefined3 in_register_00000031;
  
  if (CONCAT31(in_register_00000031,visible) == 0) {
    if ((this->isVisibleInParent != false) && (this->framePanel != (PANEL *)0x0)) {
      (*(this->super_IWindow).super_IOrderable._vptr_IOrderable[0x30])();
      return;
    }
  }
  else if (this->isVisibleInParent != false) {
    if (this->framePanel != (PANEL *)0x0) {
      (*(this->super_IWindow).super_IOrderable._vptr_IOrderable[5])();
      return;
    }
    Recreate(this);
    return;
  }
  return;
}

Assistant:

void Window::OnParentVisibilityChanged(bool visible) {
    if (!visible && this->isVisibleInParent) {
        if (this->framePanel) {
            this->Destroy();
        }
    }
    else if (visible && this->isVisibleInParent) {
        if (this->framePanel) {
            this->Redraw();
        }
        else {
            this->Recreate();
        }
    }
}